

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  AssertHelper local_1c8;
  Message local_1c0 [6];
  exception *e_2;
  TrueWithString gtest_msg_2;
  Message local_168 [2];
  system_error *anon_var_0;
  type e_1;
  duration<long,_std::ratio<1L,_1L>_> local_128;
  byte local_119;
  undefined1 local_118 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg_1;
  AssertHelper local_d8;
  Message local_d0 [6];
  exception *e;
  undefined1 local_90 [8];
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedTimedMutexTest_RecurseTryLockFor_Test<yamc::checked::timed_mutex> *this_local;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8))
  ;
  memset(local_90,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_90);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_90);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::lock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&gtest_msg_1.value.field_2 + 8),
                   "Expected: mtx.lock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xe8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)(gtest_msg_1.value.field_2._M_local_buf + 8));
    testing::Message::~Message(local_d0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_90);
  if ((int)e != 0) goto LAB_001f6d5a;
  memset(local_118,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_118);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_118);
  if (bVar1) {
    local_119 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      e_1._4_4_ = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_128,(int *)((long)&e_1 + 4));
      yamc::checked::timed_mutex::try_lock_for<long,std::ratio<1l,1l>>
                ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8),&local_128);
    }
    if ((local_119 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_118,
                 "Expected: mtx.try_lock_for(std::chrono::seconds(1)) throws an exception of type std::system_error.\n  Actual: it throws nothing."
                );
      goto LAB_001f694b;
    }
  }
  else {
LAB_001f694b:
    testing::Message::Message(local_168);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xe9,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8),local_168);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&gtest_msg_2.value.field_2 + 8));
    testing::Message::~Message(local_168);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_118);
  memset(&e_2,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)&e_2);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)&e_2);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    e._0_4_ = 0;
  }
  else {
    testing::Message::Message(local_1c0);
    std::operator+(&local_1e8,"Expected: mtx.unlock() doesn\'t throw an exception.\n  Actual: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c8,local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    testing::Message::~Message(local_1c0);
    e._0_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)&e_2);
  if ((int)e == 0) {
    e._0_4_ = 0;
  }
LAB_001f6d5a:
  yamc::checked::timed_mutex::~timed_mutex
            ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedTimedMutexTest, RecurseTryLockFor) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_for(std::chrono::seconds(1)));
  ASSERT_NO_THROW(mtx.unlock());
}